

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_function::set_mem_fn(statement_function *this)

{
  long in_RDI;
  undefined1 in_stack_00000277;
  string *in_stack_00000278;
  function *in_stack_00000280;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"this",&local_29);
  cs::function::add_reserve_var(in_stack_00000280,in_stack_00000278,(bool)in_stack_00000277);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *(undefined1 *)(in_RDI + 0xf9) = 1;
  return;
}

Assistant:

void set_mem_fn()
		{
			mFunc.add_reserve_var("this", true);
			mIsMemFn = true;
		}